

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O2

void t20(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *__s1;
  
  uVar2 = al_ustr_new("");
  lVar3 = al_ustr_append_chr(uVar2,0x61);
  if (lVar3 == 1) {
    log_printf("OK   %s\n","al_ustr_append_chr(us, \'a\') == 1");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_append_chr(us, \'a\') == 1");
    error = error + 1;
  }
  lVar3 = al_ustr_append_chr(uVar2,0xe6);
  if (lVar3 == 2) {
    log_printf("OK   %s\n","al_ustr_append_chr(us, U_ae) == 2");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_append_chr(us, U_ae) == 2");
    error = error + 1;
  }
  lVar3 = al_ustr_append_chr(uVar2,0x20ac);
  if (lVar3 == 3) {
    log_printf("OK   %s\n","al_ustr_append_chr(us, U_euro) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_append_chr(us, U_euro) == 3");
    error = error + 1;
  }
  __s1 = (char *)al_cstr(uVar2);
  iVar1 = strcmp(__s1,anon_var_dwarf_82e);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_83a);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_83a);
    error = error + 1;
  }
  lVar3 = al_ustr_append_chr(uVar2,0xffffffffffffffff);
  if (lVar3 == 0) {
    log_printf("OK   %s\n","al_ustr_append_chr(us, -1) == 0");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_append_chr(us, -1) == 0");
    error = error + 1;
  }
  lVar3 = al_ustr_append_chr(uVar2,&_GLOBAL_OFFSET_TABLE_);
  if (lVar3 == 0) {
    log_printf("OK   %s\n","al_ustr_append_chr(us, 0x110000) == 0");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_append_chr(us, 0x110000) == 0");
    error = error + 1;
  }
  al_ustr_free(uVar2);
  return;
}

Assistant:

static void t20(void)
{
   ALLEGRO_USTR *us = al_ustr_new("");

   CHECK(al_ustr_append_chr(us, 'a') == 1);
   CHECK(al_ustr_append_chr(us, U_ae) == 2);
   CHECK(al_ustr_append_chr(us, U_euro) == 3);
   CHECK(0 == strcmp(al_cstr(us), "aæ€"));

   /* Invalid code points. */
   CHECK(al_ustr_append_chr(us, -1) == 0);
   CHECK(al_ustr_append_chr(us, 0x110000) == 0);

   al_ustr_free(us);
}